

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O3

void __thiscall cppcms::filters::datetime::datetime(datetime *this,datetime *other)

{
  pointer pcVar1;
  
  streamable::streamable(&this->time_,&other->time_);
  (this->tz_)._M_dataplus._M_p = (pointer)&(this->tz_).field_2;
  pcVar1 = (other->tz_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->tz_,pcVar1,pcVar1 + (other->tz_)._M_string_length);
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

datetime::datetime(datetime const &other) : time_(other.time_),tz_(other.tz_) {}